

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool is_wielded(CHAR_DATA *ch,int weapon,int type)

{
  OBJ_DATA *pOVar1;
  int in_EDX;
  int in_ESI;
  CHAR_DATA *in_RDI;
  bool primary;
  OBJ_DATA *wield;
  bool local_1;
  
  pOVar1 = get_eq_char(in_RDI,0x10);
  if (pOVar1 == (OBJ_DATA *)0x0) {
    if ((in_ESI == 10) && (pOVar1 = get_eq_char(in_RDI,0x12), pOVar1 == (OBJ_DATA *)0x0)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    if (pOVar1->value[0] == in_ESI) {
      if ((in_EDX == 1) || (in_EDX == 3)) {
        return true;
      }
    }
    else if (in_EDX == 3) {
      return false;
    }
    pOVar1 = get_eq_char(in_RDI,0x12);
    if (pOVar1 == (OBJ_DATA *)0x0) {
      local_1 = false;
    }
    else if (pOVar1->value[0] == in_ESI) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool is_wielded(CHAR_DATA *ch, int weapon, int type)
{

	OBJ_DATA *wield;
	bool primary = false;

	wield = get_eq_char(ch, WEAR_WIELD);
	if (wield == nullptr)
	{
		if (weapon == WEAPON_HAND && (get_eq_char(ch, WEAR_DUAL_WIELD) == nullptr))
			return true;
		else
			return false;
	}

	if (wield->value[0] == weapon)
	{
		if (type == WIELD_ONE || type == WIELD_PRIMARY)
			return true;

		primary = false;
	}
	else
	{
		if (type == WIELD_PRIMARY)
			return false;
	}

	wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	if (wield == nullptr)
	{
		return false;
	}
	if (wield->value[0] == weapon)
	{
		if (type == WIELD_TWO && primary)
			return true;
	}
	else
	{
		return false;
	}

	return true;
}